

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.h
# Opt level: O0

cmCMakePath * __thiscall cmCMakePath::GetStem(cmCMakePath *__return_storage_ptr__,cmCMakePath *this)

{
  path local_40;
  cmCMakePath *local_18;
  cmCMakePath *this_local;
  
  local_18 = this;
  this_local = __return_storage_ptr__;
  std::filesystem::__cxx11::path::stem(&local_40,&this->Path);
  cmCMakePath(__return_storage_ptr__,&local_40);
  std::filesystem::__cxx11::path::~path(&local_40);
  return __return_storage_ptr__;
}

Assistant:

cmCMakePath GetStem() const { return this->Path.stem(); }